

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O2

void anon_unknown.dwarf_17898ce::blend_a64_hmask_ref
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  ulong uVar1;
  uint8_t (*pauVar2) [256];
  int col;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t mask2d [256] [256];
  
  uVar1 = 0;
  uVar4 = 0;
  if (0 < w) {
    uVar4 = (ulong)(uint)w;
  }
  uVar5 = 0;
  pauVar2 = mask2d;
  if (0 < h) {
    uVar5 = (ulong)(uint)h;
    pauVar2 = mask2d;
  }
  for (; uVar1 != uVar5; uVar1 = uVar1 + 1) {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      *(uint8_t *)((long)pauVar2 + uVar3) = mask[uVar3];
    }
    pauVar2 = (uint8_t (*) [256])((long)pauVar2 + 0x100);
  }
  aom_blend_a64_mask_c(dst,dst_stride,src0,src0_stride,src1,src1_stride,mask2d[0],0x100,w,h,0,0);
  return;
}

Assistant:

static void blend_a64_hmask_ref(uint8_t *dst, uint32_t dst_stride,
                                const uint8_t *src0, uint32_t src0_stride,
                                const uint8_t *src1, uint32_t src1_stride,
                                const uint8_t *mask, int w, int h) {
  uint8_t mask2d[BlendA64Mask1DTest8B::kMaxMaskSize]
                [BlendA64Mask1DTest8B::kMaxMaskSize];

  for (int row = 0; row < h; ++row)
    for (int col = 0; col < w; ++col) mask2d[row][col] = mask[col];

  aom_blend_a64_mask_c(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                       &mask2d[0][0], BlendA64Mask1DTest8B::kMaxMaskSize, w, h,
                       0, 0);
}